

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UChar32 utext_next32_63(UText *ut)

{
  UChar UVar1;
  int iVar2;
  UBool UVar3;
  int iVar4;
  uint uVar5;
  
  if ((ut->chunkLength <= ut->chunkOffset) &&
     (UVar3 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01'), UVar3 == '\0')) {
    return -1;
  }
  iVar2 = ut->chunkOffset;
  iVar4 = iVar2 + 1;
  ut->chunkOffset = iVar4;
  UVar1 = ut->chunkContents[iVar2];
  uVar5 = (uint)(ushort)UVar1;
  if ((uVar5 & 0xfc00) == 0xd800) {
    if ((ut->chunkLength <= iVar4) &&
       (UVar3 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01'), UVar3 == '\0')) {
      return uVar5;
    }
    if (((ushort)ut->chunkContents[ut->chunkOffset] & 0xfc00) == 0xdc00) {
      uVar5 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)ut->chunkContents[ut->chunkOffset] +
              0xfca02400;
      ut->chunkOffset = ut->chunkOffset + 1;
    }
  }
  return uVar5;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_next32(UText *ut) {
    UChar32       c;

    if (ut->chunkOffset >= ut->chunkLength) {
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            return U_SENTINEL;
        }
    }

    c = ut->chunkContents[ut->chunkOffset++];
    if (U16_IS_LEAD(c) == FALSE) {
        // Normal case, not supplementary.
        //   (A trail surrogate seen here is just returned as is, as a surrogate value.
        //    It cannot be part of a pair.)
        return c;
    }

    if (ut->chunkOffset >= ut->chunkLength) {
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            // c is an unpaired lead surrogate at the end of the text.
            // return it as it is.
            return c;
        }
    }
    UChar32 trail = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_TRAIL(trail) == FALSE) {
        // c was an unpaired lead surrogate, not at the end of the text.
        // return it as it is (unpaired).  Iteration position is on the
        // following character, possibly in the next chunk, where the
        //  trail surrogate would have been if it had existed.
        return c;
    }

    UChar32 supplementary = U16_GET_SUPPLEMENTARY(c, trail);
    ut->chunkOffset++;   // move iteration position over the trail surrogate.
    return supplementary;
    }